

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

int32 fsg_model_tag_trans_add(fsg_model_t *fsg,int32 from,int32 to,int32 logp,int32 wid)

{
  hash_table_t *phVar1;
  fsg_link_t *pfVar2;
  int32 *val;
  int32 *piVar3;
  fsg_link_t *link2;
  fsg_link_t *link;
  int32 wid_local;
  int32 logp_local;
  int32 to_local;
  int32 from_local;
  fsg_model_t *fsg_local;
  
  if (0 < logp) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
            ,0x89,"Null transition prob must be <= 1.0 (state %d -> %d)\n",(ulong)(uint)from,
            (ulong)(uint)to);
    exit(1);
  }
  if (from == to) {
    fsg_local._4_4_ = -1;
  }
  else {
    if (fsg->trans[from].null_trans == (hash_table_t *)0x0) {
      phVar1 = hash_table_new(5,0);
      fsg->trans[from].null_trans = phVar1;
    }
    pfVar2 = fsg_model_null_trans(fsg,from,to);
    if (pfVar2 == (fsg_link_t *)0x0) {
      val = (int32 *)__listelem_malloc__(fsg->link_alloc,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                         ,0x9f);
      *val = from;
      val[1] = to;
      val[2] = logp;
      val[3] = -1;
      piVar3 = (int32 *)hash_table_enter_bkey(fsg->trans[from].null_trans,(char *)(val + 1),4,val);
      if (val != piVar3) {
        __assert_fail("link == link2",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                      ,0xa9,
                      "int32 fsg_model_tag_trans_add(fsg_model_t *, int32, int32, int32, int32)");
      }
      fsg_local._4_4_ = 1;
    }
    else if (pfVar2->logs2prob < logp) {
      pfVar2->logs2prob = logp;
      fsg_local._4_4_ = 0;
    }
    else {
      fsg_local._4_4_ = -1;
    }
  }
  return fsg_local._4_4_;
}

Assistant:

int32
fsg_model_tag_trans_add(fsg_model_t * fsg, int32 from, int32 to,
                        int32 logp, int32 wid)
{
    fsg_link_t *link, *link2;

    (void)wid;
    /* Check for transition probability */
    if (logp > 0) {
        E_FATAL("Null transition prob must be <= 1.0 (state %d -> %d)\n",
                from, to);
    }

    /* Self-loop null transitions (with prob <= 1.0) are redundant */
    if (from == to)
        return -1;

    if (fsg->trans[from].null_trans == NULL)
        fsg->trans[from].null_trans = hash_table_new(5, HASH_CASE_YES);

    /* Check for a duplicate link; if found, keep the higher prob */
    link = fsg_model_null_trans(fsg, from, to);
    if (link) {
        if (link->logs2prob < logp) {
            link->logs2prob = logp;
            return 0;
        }
        else
            return -1;
    }

    /* Create null transition object */
    link = listelem_malloc(fsg->link_alloc);
    link->from_state = from;
    link->to_state = to;
    link->logs2prob = logp;
    link->wid = -1;

    link2 = (fsg_link_t *)
        hash_table_enter_bkey(fsg->trans[from].null_trans,
                              (char const *) &link->to_state,
                              sizeof(link->to_state), link);
    assert(link == link2);
    (void)link2;

    return 1;
}